

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O3

void GenerateDitherQ7Lb(int16_t *bufQ7,uint32_t seed,int length,int16_t AvgPitchGain_Q12)

{
  ulong uVar1;
  short sVar2;
  int iVar3;
  short sVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  if (length < 0x266) {
    uVar1 = 0xfffffffffffffffd;
    do {
      iVar3 = seed * 0xbb38435;
      iVar5 = seed * -0x4b9b4d07;
      seed = iVar5 + 0x9d6f2492;
      uVar6 = seed >> 0x19 & 0xf;
      sVar4 = (short)(iVar5 + -0x6190db6e >> 0x19);
      sVar2 = (short)(iVar3 + 0x3719636b >> 0x19);
      if (uVar6 < 5) {
        bufQ7[uVar1 + 3] = sVar2;
        bufQ7[uVar1 + 4] = sVar4;
        bufQ7[uVar1 + 5] = 0;
      }
      else {
        if (uVar6 < 10) {
          bufQ7[uVar1 + 3] = sVar2;
          bufQ7[uVar1 + 4] = 0;
        }
        else {
          bufQ7[uVar1 + 3] = 0;
          bufQ7[uVar1 + 4] = sVar2;
        }
        bufQ7[uVar1 + 5] = sVar4;
      }
      uVar1 = uVar1 + 3;
    } while (uVar1 < 0x1db);
  }
  else {
    uVar6 = 0xfffffffe;
    do {
      iVar3 = seed * 0xbb38435;
      seed = iVar3 + 0x3619636b;
      uVar7 = seed >> 0x19 & 1;
      bufQ7[uVar6 + uVar7 + 2] =
           (int16_t)((iVar3 + 0x3719636b >> 0x19) * (int)(short)((short)length * -10 + 0x5800) +
                     0x2000U >> 0xe);
      bufQ7[(uVar6 - uVar7) + 3] = 0;
      uVar6 = uVar6 + 2;
    } while (uVar6 < 0x1dd);
  }
  return;
}

Assistant:

static void GenerateDitherQ7Lb(int16_t* bufQ7, uint32_t seed,
                               int length, int16_t AvgPitchGain_Q12) {
  int   k, shft;
  int16_t dither1_Q7, dither2_Q7, dither_gain_Q14;

  /* This threshold should be equal to that in decode_spec(). */
  if (AvgPitchGain_Q12 < 614) {
    for (k = 0; k < length - 2; k += 3) {
      /* New random unsigned int. */
      seed = (seed * 196314165) + 907633515;

      /* Fixed-point dither sample between -64 and 64 (Q7). */
      /* dither = seed * 128 / 4294967295 */
      dither1_Q7 = (int16_t)(((int32_t)(seed + 16777216)) >> 25);

      /* New random unsigned int. */
      seed = (seed * 196314165) + 907633515;

      /* Fixed-point dither sample between -64 and 64. */
      dither2_Q7 = (int16_t)(((int32_t)(seed + 16777216)) >> 25);

      shft = (seed >> 25) & 15;
      if (shft < 5) {
        bufQ7[k]   = dither1_Q7;
        bufQ7[k + 1] = dither2_Q7;
        bufQ7[k + 2] = 0;
      } else if (shft < 10) {
        bufQ7[k]   = dither1_Q7;
        bufQ7[k + 1] = 0;
        bufQ7[k + 2] = dither2_Q7;
      } else {
        bufQ7[k]   = 0;
        bufQ7[k + 1] = dither1_Q7;
        bufQ7[k + 2] = dither2_Q7;
      }
    }
  } else {
    dither_gain_Q14 = (int16_t)(22528 - 10 * AvgPitchGain_Q12);

    /* Dither on half of the coefficients. */
    for (k = 0; k < length - 1; k += 2) {
      /* New random unsigned int */
      seed = (seed * 196314165) + 907633515;

      /* Fixed-point dither sample between -64 and 64. */
      dither1_Q7 = (int16_t)(((int32_t)(seed + 16777216)) >> 25);

      /* Dither sample is placed in either even or odd index. */
      shft = (seed >> 25) & 1;     /* Either 0 or 1 */

      bufQ7[k + shft] = (((dither_gain_Q14 * dither1_Q7) + 8192) >> 14);
      bufQ7[k + 1 - shft] = 0;
    }
  }
}